

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_write_sig_alg_ext(mbedtls_ssl_context *ssl,uchar *buf,uchar *end,size_t *out_len)

{
  mbedtls_ssl_handshake_params *pmVar1;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  ushort uVar5;
  ushort *puVar6;
  size_t sVar7;
  ushort *puVar8;
  
  *out_len = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x2440,"adding signature_algorithms extension");
  iVar3 = -0x6a00;
  if (5 < (ulong)((long)end - (long)buf) && buf <= end) {
    pmVar1 = ssl->handshake;
    if (((pmVar1 == (mbedtls_ssl_handshake_params *)0x0) ||
        (pmVar1->sig_algs_heap_allocated != '\x01')) ||
       (puVar6 = pmVar1->sig_algs, puVar6 == (ushort *)0x0)) {
      puVar6 = ssl->conf->sig_algs;
    }
    if (puVar6 == (ushort *)0x0) {
      iVar3 = -0x5e80;
    }
    else {
      uVar2 = *puVar6;
      if (uVar2 == 0) {
        sVar7 = 6;
      }
      else {
        puVar8 = (ushort *)(buf + 6);
        sVar7 = 6;
        do {
          pcVar4 = mbedtls_ssl_sig_alg_to_str(uVar2);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x2456,"got signature scheme [%x] %s",(ulong)uVar2,pcVar4);
          if (((ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) &&
              (uVar2 = *puVar6, (char)uVar2 == '\x03')) && (0xfd < (byte)((char)(uVar2 >> 8) - 5U)))
          {
            if ((end < puVar8) || ((ulong)((long)end - (long)puVar8) < 2)) {
              return -0x6a00;
            }
            *puVar8 = uVar2 << 8 | uVar2 >> 8;
            sVar7 = sVar7 + 2;
            uVar2 = *puVar6;
            pcVar4 = mbedtls_ssl_sig_alg_to_str(uVar2);
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                       ,0x245f,"sent signature scheme [%x] %s",(ulong)uVar2,pcVar4);
          }
          puVar8 = (ushort *)(buf + sVar7);
          uVar2 = puVar6[1];
          puVar6 = puVar6 + 1;
        } while (uVar2 != 0);
      }
      if (sVar7 == 6) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x2465,"No signature algorithms defined.");
        iVar3 = -0x6c00;
      }
      else {
        buf[0] = '\0';
        buf[1] = '\r';
        uVar2 = (short)sVar7 - 6;
        uVar5 = (short)sVar7 - 4;
        *(ushort *)(buf + 2) = uVar5 * 0x100 | uVar5 >> 8;
        *(ushort *)(buf + 4) = uVar2 * 0x100 | uVar2 >> 8;
        *out_len = sVar7;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_ssl_write_sig_alg_ext(mbedtls_ssl_context *ssl, unsigned char *buf,
                                  const unsigned char *end, size_t *out_len)
{
    unsigned char *p = buf;
    unsigned char *supported_sig_alg; /* Start of supported_signature_algorithms */
    size_t supported_sig_alg_len = 0; /* Length of supported_signature_algorithms */

    *out_len = 0;

    MBEDTLS_SSL_DEBUG_MSG(3, ("adding signature_algorithms extension"));

    /* Check if we have space for header and length field:
     * - extension_type         (2 bytes)
     * - extension_data_length  (2 bytes)
     * - supported_signature_algorithms_length   (2 bytes)
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, 6);
    p += 6;

    /*
     * Write supported_signature_algorithms
     */
    supported_sig_alg = p;
    const uint16_t *sig_alg = mbedtls_ssl_get_sig_algs(ssl);
    if (sig_alg == NULL) {
        return MBEDTLS_ERR_SSL_BAD_CONFIG;
    }

    for (; *sig_alg != MBEDTLS_TLS1_3_SIG_NONE; sig_alg++) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("got signature scheme [%x] %s",
                                  *sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(*sig_alg)));
        if (!mbedtls_ssl_sig_alg_is_supported(ssl, *sig_alg)) {
            continue;
        }
        MBEDTLS_SSL_CHK_BUF_PTR(p, end, 2);
        MBEDTLS_PUT_UINT16_BE(*sig_alg, p, 0);
        p += 2;
        MBEDTLS_SSL_DEBUG_MSG(3, ("sent signature scheme [%x] %s",
                                  *sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(*sig_alg)));
    }

    /* Length of supported_signature_algorithms */
    supported_sig_alg_len = p - supported_sig_alg;
    if (supported_sig_alg_len == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("No signature algorithms defined."));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    MBEDTLS_PUT_UINT16_BE(MBEDTLS_TLS_EXT_SIG_ALG, buf, 0);
    MBEDTLS_PUT_UINT16_BE(supported_sig_alg_len + 2, buf, 2);
    MBEDTLS_PUT_UINT16_BE(supported_sig_alg_len, buf, 4);

    *out_len = p - buf;

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    mbedtls_ssl_tls13_set_hs_sent_ext_mask(ssl, MBEDTLS_TLS_EXT_SIG_ALG);
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

    return 0;
}